

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxeffectslot.cpp
# Opt level: O0

void alGenAuxiliaryEffectSlots(ALsizei n,ALuint *effectslots)

{
  bool bVar1;
  undefined1 uVar2;
  ALCcontext *pAVar3;
  ALCcontext *pAVar4;
  ALeffectslot *this;
  ALuint *in_RSI;
  uint in_EDI;
  char *pcVar5;
  ALuint *in_stack_00000048;
  ALsizei in_stack_00000054;
  ALeffectslot *slot_1;
  ALsizei count;
  vector<ALuint> ids;
  ALeffectslot *slot;
  ALCdevice *device;
  unique_lock<std::mutex> slotlock;
  ContextRef context;
  mutex_type *in_stack_ffffffffffffff28;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *this_00;
  unique_lock<std::mutex> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>_>
  __last;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>_>
  in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *in_stack_ffffffffffffff60;
  intrusive_ptr<ALCcontext> *this_01;
  ALCcontext *in_stack_ffffffffffffff68;
  ALuint AVar6;
  uint uVar7;
  uint local_64;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> local_60;
  ALeffectslot *local_48;
  ALCdevice *local_40;
  int local_28;
  intrusive_ptr<ALCcontext> local_18;
  ALuint *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  GetContextRef();
  bVar1 = al::intrusive_ptr::operator_cast_to_bool((intrusive_ptr *)&local_18);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_28 = 1;
    goto LAB_001394ce;
  }
  if ((int)local_4 < 0) {
    pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
    ALCcontext::setError(pAVar3,0xa003,"Generating %d effect slots",(ulong)local_4);
  }
  if ((int)local_4 < 1) {
    local_28 = 1;
    goto LAB_001394ce;
  }
  al::intrusive_ptr<ALCcontext>::operator->(&local_18);
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
  local_40 = al::intrusive_ptr<ALCdevice>::get(&pAVar3->mDevice);
  AVar6 = local_40->AuxiliaryEffectSlotMax;
  uVar7 = local_4;
  pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
  if (AVar6 - pAVar3->mNumEffectSlots < uVar7) {
    this_01 = &local_18;
    pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(this_01);
    uVar7 = local_40->AuxiliaryEffectSlotMax;
    pAVar4 = al::intrusive_ptr<ALCcontext>::operator->(this_01);
    ALCcontext::setError
              (pAVar3,0xa005,"Exceeding %u effect slot limit (%u + %d)",(ulong)uVar7,
               (ulong)pAVar4->mNumEffectSlots,(ulong)local_4);
    local_28 = 1;
  }
  else {
    al::intrusive_ptr<ALCcontext>::get(&local_18);
    uVar2 = anon_unknown.dwarf_99ca::EnsureEffectSlots
                      (in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
    if ((bool)uVar2) {
      if (local_4 == 1) {
        al::intrusive_ptr<ALCcontext>::get(&local_18);
        local_48 = anon_unknown.dwarf_99ca::AllocEffectSlot((ALCcontext *)CONCAT44(uVar7,AVar6));
        if (local_48 == (ALeffectslot *)0x0) {
          local_28 = 1;
        }
        else {
          *local_10 = local_48->id;
LAB_001394b6:
          local_28 = 0;
        }
      }
      else {
        __last._M_current = (uint *)&local_60;
        std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::vector
                  ((vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)0x139370);
        local_64 = local_4;
        std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve
                  (in_stack_ffffffffffffff60,CONCAT17(uVar2,in_stack_ffffffffffffff58));
        do {
          al::intrusive_ptr<ALCcontext>::get(&local_18);
          this = anon_unknown.dwarf_99ca::AllocEffectSlot((ALCcontext *)CONCAT44(uVar7,AVar6));
          if (this == (ALeffectslot *)0x0) {
            std::unique_lock<std::mutex>::unlock(in_stack_ffffffffffffff30);
            in_stack_ffffffffffffff30 = (unique_lock<std::mutex> *)&local_60;
            std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::size
                      ((vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)
                       in_stack_ffffffffffffff30);
            std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::data
                      ((vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)0x1393e9);
            alDeleteAuxiliaryEffectSlots(in_stack_00000054,in_stack_00000048);
            local_28 = 1;
            goto LAB_0013949d;
          }
          std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::emplace_back<unsigned_int&>
                    ((vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)this,
                     (uint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          local_64 = local_64 - 1;
        } while (local_64 != 0);
        this_00 = &local_60;
        std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::cbegin(this_00);
        std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::cend(this_00);
        std::
        copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>>,unsigned_int*>
                  (in_stack_ffffffffffffff50,__last,(uint *)this);
        local_28 = 0;
LAB_0013949d:
        std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::~vector
                  ((vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)this);
        if (local_28 == 0) goto LAB_001394b6;
      }
    }
    else {
      pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
      pcVar5 = "s";
      if (local_4 == 1) {
        pcVar5 = "";
      }
      ALCcontext::setError(pAVar3,0xa005,"Failed to allocate %d effectslot%s",(ulong)local_4,pcVar5)
      ;
      local_28 = 1;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff30);
LAB_001394ce:
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr
            ((intrusive_ptr<ALCcontext> *)in_stack_ffffffffffffff30);
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenAuxiliaryEffectSlots(ALsizei n, ALuint *effectslots)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d effect slots", n);
    if UNLIKELY(n <= 0) return;

    std::unique_lock<std::mutex> slotlock{context->mEffectSlotLock};
    ALCdevice *device{context->mDevice.get()};
    if(static_cast<ALuint>(n) > device->AuxiliaryEffectSlotMax-context->mNumEffectSlots)
    {
        context->setError(AL_OUT_OF_MEMORY, "Exceeding %u effect slot limit (%u + %d)",
            device->AuxiliaryEffectSlotMax, context->mNumEffectSlots, n);
        return;
    }
    if(!EnsureEffectSlots(context.get(), static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d effectslot%s", n,
            (n==1) ? "" : "s");
        return;
    }

    if(n == 1)
    {
        ALeffectslot *slot{AllocEffectSlot(context.get())};
        if(!slot) return;
        effectslots[0] = slot->id;
    }
    else
    {
        al::vector<ALuint> ids;
        ALsizei count{n};
        ids.reserve(static_cast<ALuint>(count));
        do {
            ALeffectslot *slot{AllocEffectSlot(context.get())};
            if(!slot)
            {
                slotlock.unlock();
                alDeleteAuxiliaryEffectSlots(static_cast<ALsizei>(ids.size()), ids.data());
                return;
            }
            ids.emplace_back(slot->id);
        } while(--count);
        std::copy(ids.cbegin(), ids.cend(), effectslots);
    }
}